

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

bool QAnyStringView::equal(QAnyStringView lhs,QAnyStringView rhs)

{
  int iVar1;
  ulong uVar2;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 __s2;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar3;
  ulong uVar4;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar5;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 __s1;
  ulong __n;
  ulong uVar6;
  bool bVar7;
  QBasicUtf8StringView<false> rhs_00;
  QLatin1StringView lhs_00;
  
  uVar4 = lhs.m_size;
  __s1 = lhs.field_0;
  uVar2 = rhs.m_size;
  __s2 = rhs.field_0;
  __n = uVar4 & 0x3fffffffffffffff;
  uVar6 = uVar2 & 0x3fffffffffffffff;
  if ((__n == uVar6) || (uVar4 < 0x4000000000000000 != uVar2 < 0x4000000000000000)) {
    if ((uVar4 & 0xc000000000000000) == 0x4000000000000000) {
      uVar4 = uVar6;
      aVar3 = __s2;
      aVar5 = __s1;
      uVar6 = __n;
      if ((uVar2 & 0xc000000000000000) != 0x4000000000000000) goto LAB_0032880f;
    }
    else {
      uVar4 = __n;
      aVar3 = __s1;
      aVar5 = __s2;
      if ((uVar2 & 0xc000000000000000) == 0x4000000000000000) {
LAB_0032880f:
        rhs_00.m_size = uVar4;
        rhs_00.m_data = (storage_type *)aVar3.m_data;
        lhs_00.m_data = aVar5.m_data_utf8;
        lhs_00.m_size = uVar6;
        bVar7 = QtPrivate::equalStrings(lhs_00,rhs_00);
        return bVar7;
      }
      if (__n != uVar6) goto LAB_00328834;
    }
    if (((undefined1  [16])lhs & (undefined1  [16])0x3fffffffffffffff) == (undefined1  [16])0x0) {
      bVar7 = true;
    }
    else {
      iVar1 = bcmp(__s1.m_data,__s2.m_data,__n);
      bVar7 = iVar1 == 0;
    }
  }
  else {
LAB_00328834:
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool QAnyStringView::equal(QAnyStringView lhs, QAnyStringView rhs) noexcept
{
    if (lhs.size() != rhs.size() && lhs.isUtf8() == rhs.isUtf8())
        return false;
    return lhs.visit([rhs](auto lhs) {
        return rhs.visit([lhs](auto rhs) {
            return QtPrivate::equalStrings(lhs, rhs);
        });
    });
}